

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (double *idata,AggregateInputData *aggr_input_data,
               QuantileState<double,_duckdb::QuantileStandardType> **states,ValidityMask *mask,
               idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  QuantileState<double,_duckdb::QuantileStandardType> *pQVar3;
  iterator iVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  QuantileState<double,_duckdb::QuantileStandardType> **ppQVar11;
  double *pdVar12;
  double local_68;
  ulong local_60;
  ulong local_58;
  ValidityMask *local_50;
  ulong local_48;
  QuantileState<double,_duckdb::QuantileStandardType> **local_40;
  double *local_38;
  
  local_58 = count;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar7 = 0;
      do {
        pQVar3 = states[iVar7];
        local_68 = idata[iVar7];
        iVar4._M_current =
             (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)pQVar3,iVar4,&local_68);
        }
        else {
          *iVar4._M_current = local_68;
          (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      } while (local_58 != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar6 = 0;
    uVar9 = 0;
    local_50 = mask;
    local_40 = states;
    local_38 = idata;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      ppQVar11 = states;
      pdVar12 = idata;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = uVar9 + 0x40;
        if (local_58 <= uVar9 + 0x40) {
          uVar10 = local_58;
        }
LAB_004ed6be:
        uVar5 = uVar9;
        if (uVar9 < uVar10) {
          do {
            pQVar3 = states[uVar9];
            local_68 = idata[uVar9];
            iVar4._M_current =
                 (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)pQVar3,iVar4,&local_68);
            }
            else {
              *iVar4._M_current = local_68;
              (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            uVar9 = uVar9 + 1;
            uVar5 = uVar10;
          } while (uVar10 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar6];
        uVar10 = uVar9 + 0x40;
        if (local_58 <= uVar9 + 0x40) {
          uVar10 = local_58;
        }
        local_60 = uVar6;
        if (uVar2 == 0xffffffffffffffff) goto LAB_004ed6be;
        uVar5 = uVar10;
        if ((uVar2 != 0) && (mask = local_50, uVar5 = uVar9, uVar9 < uVar10)) {
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              pQVar3 = states[uVar9 + uVar8];
              local_68 = idata[uVar9 + uVar8];
              iVar4._M_current =
                   (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)pQVar3,iVar4,&local_68);
                ppQVar11 = local_40;
                pdVar12 = local_38;
              }
              else {
                *iVar4._M_current = local_68;
                (((_Vector_base<double,_std::allocator<double>_> *)&pQVar3->v)->_M_impl).
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
            }
            uVar8 = uVar8 + 1;
            uVar6 = local_60;
            mask = local_50;
            uVar5 = uVar10;
          } while (uVar10 - uVar9 != uVar8);
        }
      }
      uVar9 = uVar5;
      uVar6 = uVar6 + 1;
      states = ppQVar11;
      idata = pdVar12;
    } while (uVar6 != local_48);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}